

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O1

void __thiscall SBLA::FirstScan(SBLA *this)

{
  long lVar1;
  char cVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  long local_e8;
  long local_e0;
  long local_d8;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar7 = *(int *)&pMVar3->field_0xc;
  this->N = iVar7;
  iVar8 = *(int *)&pMVar3->field_0x8;
  this->M = iVar8;
  cv::Mat::Mat(local_90,iVar8,iVar7,4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pcVar9 = *(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
  cVar2 = *pcVar9;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = cVar2;
  if (cVar2 == '\0') goto LAB_001d9802;
  *pcVar9 = '\0';
  if (this->M == 1) {
    uVar31 = 1;
    if (this->N != 1) {
      lVar10 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
LAB_001d97c2:
      pcVar9 = (char *)(lVar10 + 1);
LAB_001d97db:
      uVar31 = (uint)(*pcVar9 == '\0');
    }
  }
  else {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar10 = *(long *)&pMVar3->field_0x10;
    if (this->N == 1) {
      pcVar9 = (char *)(lVar10 + **(long **)&pMVar3->field_0x48);
      goto LAB_001d97db;
    }
    uVar31 = 0;
    if ((*(char *)(lVar10 + 1) == '\0') &&
       (*(char *)(lVar10 + **(long **)&pMVar3->field_0x48) == '\0')) {
      lVar10 = lVar10 + **(long **)&pMVar3->field_0x48;
      goto LAB_001d97c2;
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar31;
LAB_001d9802:
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar31 = *(uint *)&pMVar4->field_0x8;
  uVar14 = uVar31 & 0xfffffffe;
  if ((int)uVar14 < 1) {
    uVar27 = 0;
    iVar7 = 0;
    lVar10 = 0;
  }
  else {
    iVar8 = this->N;
    iVar21 = iVar8 * 2;
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    local_d8 = *(long *)&pMVar3->field_0x10;
    lVar5 = **(long **)&pMVar3->field_0x48;
    lVar20 = *(long *)&pMVar4->field_0x10;
    lVar18 = **(long **)&pMVar4->field_0x48;
    local_e0 = lVar20 + lVar18;
    local_e8 = local_d8 + lVar5;
    lVar5 = lVar5 * 2;
    uVar27 = 0;
    iVar7 = 0;
    lVar15 = 0;
    lVar22 = lVar20;
    do {
      if (0 < this->N) {
        lVar10 = 0;
        do {
          *(uint *)(lVar22 + lVar10 * 4) = (uint)*(byte *)(local_d8 + lVar10);
          *(uint *)(local_e0 + lVar10 * 4) = (uint)*(byte *)(local_e8 + lVar10);
          lVar10 = lVar10 + 1;
        } while (lVar10 < this->N);
      }
      lVar13 = lVar18 * uVar27 + lVar20;
      lVar10 = lVar18 + lVar13;
      if (0 < this->N) {
        iVar19 = 0;
        do {
          lVar11 = (long)iVar19;
          iVar24 = *(int *)(lVar13 + lVar11 * 4);
          if (*(int *)(lVar10 + lVar11 * 4) == 0) {
            iVar16 = iVar19;
            if (iVar24 != 0) {
              iVar28 = -(iVar7 + iVar19);
              goto LAB_001d9933;
            }
          }
          else {
            iVar28 = -(iVar8 + iVar19);
            *(int *)(lVar10 + lVar11 * 4) = iVar28;
            if (iVar24 != 0) {
LAB_001d9933:
              *(int *)(lVar13 + lVar11 * 4) = iVar28;
            }
            iVar16 = iVar19 + 1;
            iVar24 = iVar19;
            if (iVar16 < this->N) {
              lVar11 = lVar22 + (long)iVar16 * 4;
              lVar12 = 0;
              do {
                iVar24 = *(int *)(lVar11 + lVar12 * 4);
                if (*(int *)(lVar11 + lVar18 + lVar12 * 4) == 0) {
                  if (iVar24 == 0) {
                    iVar16 = iVar16 + (int)lVar12;
                    iVar24 = (int)lVar12 + iVar19;
                    goto LAB_001d99a4;
                  }
LAB_001d996d:
                  *(int *)(lVar11 + lVar12 * 4) = iVar28;
                }
                else {
                  *(int *)(lVar11 + lVar18 + lVar12 * 4) = iVar28;
                  if (iVar24 != 0) goto LAB_001d996d;
                }
                lVar1 = iVar16 + lVar12;
                lVar12 = lVar12 + 1;
              } while (lVar1 + 1 < (long)this->N);
              iVar16 = iVar16 + (int)lVar12;
              iVar24 = (int)lVar12 + iVar19;
            }
LAB_001d99a4:
            if ((uVar27 != 0) && (iVar19 <= iVar24)) {
              iVar29 = -0x80000000;
              do {
                lVar11 = (long)iVar19;
                if (*(int *)(lVar13 + lVar11 * 4) != 0) {
                  iVar25 = 1;
                  if (1 < iVar19) {
                    iVar25 = iVar19;
                  }
                  iVar25 = iVar25 + -1;
                  iVar30 = this->N;
                  iVar26 = iVar19;
                  iVar23 = iVar19 + 1;
                  if (iVar19 + 1 < iVar30) {
                    iVar23 = iVar30;
                  }
                  do {
                    lVar11 = lVar11 + 1;
                    iVar19 = iVar23;
                    if (iVar30 <= lVar11) break;
                    iVar19 = iVar26 + 1;
                    iVar26 = iVar19;
                  } while (*(int *)(lVar22 + lVar11 * 4) != 0);
                  iVar23 = iVar30 + -1;
                  if (iVar19 < iVar30 + -1) {
                    iVar23 = iVar19;
                  }
                  if (iVar25 <= iVar23) {
                    do {
                      iVar30 = *(int *)(lVar15 + (long)iVar25 * 4);
                      iVar26 = iVar25;
                      if (iVar30 != 0) {
                        do {
                          iVar17 = *(int *)(lVar20 + (long)-iVar30 * 4);
                          bVar33 = iVar17 != iVar30;
                          iVar30 = iVar17;
                        } while (bVar33);
                        iVar30 = iVar28;
                        if (iVar29 < iVar17) {
                          do {
                            iVar29 = *(int *)(lVar20 + (long)-iVar30 * 4);
                            iVar26 = iVar30;
                            if (iVar29 != iVar17) {
                              *(int *)(lVar20 + (long)-iVar30 * 4) = iVar17;
                              iVar26 = iVar29;
                            }
                            bVar33 = iVar29 != iVar30;
                            iVar30 = iVar26;
                          } while (iVar29 != iVar17 && bVar33);
                        }
                        else {
                          bVar33 = iVar17 < iVar29;
                          iVar30 = iVar17;
                          iVar17 = iVar29;
                          if (bVar33) {
                            do {
                              iVar26 = *(int *)(lVar20 + (long)-iVar30 * 4);
                              iVar6 = iVar30;
                              if (iVar26 != iVar29) {
                                *(int *)(lVar20 + (long)-iVar30 * 4) = iVar29;
                                iVar6 = iVar26;
                              }
                              bVar33 = iVar26 != iVar30;
                              iVar30 = iVar6;
                            } while (iVar26 != iVar29 && bVar33);
                          }
                        }
                        iVar26 = iVar25;
                        if (iVar25 <= iVar23) {
                          iVar26 = iVar23;
                        }
                        iVar26 = iVar26 + 1;
                        lVar11 = (long)iVar25;
                        do {
                          iVar29 = iVar17;
                          if (iVar23 <= lVar11) goto LAB_001d9abd;
                          lVar12 = lVar11 + 1;
                          lVar1 = lVar11 * 4;
                          lVar11 = lVar12;
                        } while (*(int *)(lVar15 + 4 + lVar1) != 0);
                        iVar26 = (int)lVar12;
                      }
LAB_001d9abd:
                      iVar25 = iVar26 + 1;
                    } while (iVar26 < iVar23);
                  }
                }
                bVar33 = iVar19 < iVar24;
                iVar19 = iVar19 + 1;
              } while (bVar33);
            }
          }
          iVar19 = iVar16 + 1;
        } while (iVar19 < this->N);
      }
      iVar7 = iVar7 + iVar21;
      iVar8 = iVar8 + iVar21;
      uVar27 = uVar27 + 2;
      local_e0 = local_e0 + lVar18 * 2;
      local_e8 = local_e8 + lVar5;
      lVar22 = lVar22 + lVar18 * 2;
      local_d8 = local_d8 + lVar5;
      lVar15 = lVar10;
    } while (uVar27 < uVar14);
  }
  if ((uVar31 & 0x80000001) == 1) {
    lVar5 = *(long *)&pMVar4->field_0x10;
    lVar20 = **(long **)&pMVar4->field_0x48 * (uVar27 & 0xffffffff) + lVar5;
    if (0 < this->N) {
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      lVar18 = **(long **)&pMVar3->field_0x48;
      lVar15 = *(long *)&pMVar3->field_0x10;
      lVar22 = 0;
      do {
        *(uint *)(lVar20 + lVar22 * 4) =
             (uint)*(byte *)((uVar27 & 0xffffffff) * lVar18 + lVar15 + lVar22);
        lVar22 = lVar22 + 1;
      } while (lVar22 < this->N);
    }
    if (0 < this->N) {
      iVar8 = 0;
      do {
        iVar21 = iVar8;
        if (*(int *)(lVar20 + (long)iVar8 * 4) != 0) {
          iVar24 = -(iVar7 + iVar8);
          *(int *)(lVar20 + (long)iVar8 * 4) = iVar24;
          uVar31 = iVar8 + 1;
          uVar32 = (ulong)uVar31;
          iVar19 = iVar8;
          if ((int)uVar31 < this->N) {
            uVar32 = (ulong)(int)uVar31;
            iVar21 = *(int *)(lVar20 + uVar32 * 4);
            while (iVar21 != 0) {
              uVar32 = uVar32 + 1;
              *(int *)(lVar20 + -4 + uVar32 * 4) = iVar24;
              if ((long)this->N <= (long)uVar32) {
                iVar19 = iVar19 + 1;
                break;
              }
              iVar19 = iVar19 + 1;
              iVar21 = *(int *)(lVar20 + uVar32 * 4);
            }
          }
          iVar21 = (int)uVar32;
          if (((int)uVar27 != 0) && (iVar8 <= iVar19)) {
            iVar16 = -0x80000000;
            do {
              lVar18 = (long)iVar8;
              iVar28 = iVar8;
              if (*(int *)(lVar20 + lVar18 * 4) != 0) {
                iVar29 = 1;
                if (1 < iVar8) {
                  iVar29 = iVar8;
                }
                iVar29 = iVar29 + -1;
                iVar25 = this->N;
                iVar30 = iVar8 + 1;
                if (iVar8 + 1 < iVar25) {
                  iVar30 = iVar25;
                }
                do {
                  lVar18 = lVar18 + 1;
                  iVar28 = iVar30;
                  if (iVar25 <= lVar18) break;
                  iVar8 = iVar8 + 1;
                  iVar28 = iVar8;
                } while (*(int *)(lVar20 + lVar18 * 4) != 0);
                iVar8 = iVar25 + -1;
                if (iVar28 < iVar25 + -1) {
                  iVar8 = iVar28;
                }
                if (iVar29 <= iVar8) {
                  do {
                    iVar25 = *(int *)(lVar10 + (long)iVar29 * 4);
                    iVar30 = iVar29;
                    if (iVar25 != 0) {
                      do {
                        iVar23 = *(int *)(lVar5 + (long)-iVar25 * 4);
                        bVar33 = iVar23 != iVar25;
                        iVar25 = iVar23;
                      } while (bVar33);
                      iVar25 = iVar24;
                      if (iVar16 < iVar23) {
                        do {
                          iVar16 = *(int *)(lVar5 + (long)-iVar25 * 4);
                          iVar30 = iVar25;
                          if (iVar16 != iVar23) {
                            *(int *)(lVar5 + (long)-iVar25 * 4) = iVar23;
                            iVar30 = iVar16;
                          }
                          bVar33 = iVar16 != iVar25;
                          iVar25 = iVar30;
                        } while (iVar16 != iVar23 && bVar33);
                      }
                      else {
                        bVar33 = iVar23 < iVar16;
                        iVar25 = iVar23;
                        iVar23 = iVar16;
                        if (bVar33) {
                          do {
                            iVar30 = *(int *)(lVar5 + (long)-iVar25 * 4);
                            iVar26 = iVar25;
                            if (iVar30 != iVar16) {
                              *(int *)(lVar5 + (long)-iVar25 * 4) = iVar16;
                              iVar26 = iVar30;
                            }
                            bVar33 = iVar30 != iVar25;
                            iVar25 = iVar26;
                          } while (iVar30 != iVar16 && bVar33);
                        }
                      }
                      iVar30 = iVar29;
                      if (iVar29 <= iVar8) {
                        iVar30 = iVar8;
                      }
                      iVar30 = iVar30 + 1;
                      lVar18 = (long)iVar29;
                      do {
                        iVar16 = iVar23;
                        if (iVar8 <= lVar18) goto LAB_001d9d46;
                        lVar15 = lVar18 + 1;
                        lVar22 = lVar18 * 4;
                        lVar18 = lVar15;
                      } while (*(int *)(lVar10 + 4 + lVar22) != 0);
                      iVar30 = (int)lVar15;
                    }
LAB_001d9d46:
                    iVar29 = iVar30 + 1;
                  } while (iVar30 < iVar8);
                }
              }
              iVar8 = iVar28 + 1;
            } while (iVar28 < iVar19);
          }
        }
        iVar8 = iVar21 + 1;
      } while (iVar8 < this->N);
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        N = img_.cols;
        M = img_.rows;
        img_labels_ = cv::Mat1i(M, N);

        // Fix for first pixel!
        n_labels_ = 0;
        firstpixel = img_.data[0];
        if (firstpixel) {
            const_cast<cv::Mat1b&>(img_).data[0] = 0;

            if (M == 1) {
                if (N == 1)
                    n_labels_ = 1;
                else
                    n_labels_ = img_.data[1] == 0;
            }
            else {
                if (N == 1)
                    n_labels_ = img_.data[img_.step[0]] == 0;
                else
                    n_labels_ = img_.data[1] == 0 && img_.data[img_.step[0]] == 0 && img_.data[img_.step[0] + 1] == 0;
            }
        }

        // Stripe extraction and representation
        unsigned int* img_labels_row_prev = nullptr;
        int rN = 0;
        int r1N = N;
        int N2 = N * 2;

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            for (int c = 0; c < N; ++c) {
                img_labels_row[c] = img_row[c];
                img_labels_row_fol[c] = img_row_fol[c];
            }

            for (int c = 0; c < N; ++c) {
                // Step 1
                int evenpix = img_labels_row[c];
                int oddpix = img_labels_row_fol[c];

                // Step 2
                int Gp;
                if (oddpix) {
                    img_labels_row_fol[c] = Gp = -(r1N + c);
                    if (evenpix)
                        img_labels_row[c] = Gp;
                }
                else if (evenpix)
                    img_labels_row[c] = Gp = -(rN + c);
                else
                    continue;

                // Step 3
                int stripestart = c;
                while (++c < N) {
                    int evenpix = img_labels_row[c];
                    int oddpix = img_labels_row_fol[c];

                    if (oddpix) {
                        img_labels_row_fol[c] = Gp;
                        if (evenpix)
                            img_labels_row[c] = Gp;
                    }
                    else if (evenpix)
                        img_labels_row[c] = Gp;
                    else
                        break;
                }
                int stripestop = c;

                if (r == 0)
                    continue;

                // Stripe union
                int lastroot = INT_MIN;
                for (int i = stripestart; i < stripestop; ++i) {
                    int linepix = img_labels_row[i];
                    if (!linepix)
                        continue;

                    int runstart = std::max(0, i - 1);
                    do
                        i++;
                    while (i < N && img_labels_row[i]);
                    int runstop = std::min(N - 1, i);

                    for (int j = runstart; j <= runstop; ++j) {
                        int curpix = img_labels_row_prev[j];
                        if (!curpix)
                            continue;

                        int newroot = FindRoot(reinterpret_cast<int*>(img_labels_.data), curpix);
                        if (newroot > lastroot) {
                            lastroot = newroot;
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), Gp, lastroot);
                        }
                        else if (newroot < lastroot) {
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), newroot, lastroot);
                        }

                        do
                            ++j;
                        while (j <= runstop && img_labels_row_prev[j]);
                    }
                }
            }
            img_labels_row_prev = img_labels_row_fol;
            rN += N2;
            r1N += N2;
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            for (int c = 0; c < N; ++c) {
                img_labels_row[c] = img_row[c];
            }

            for (int c = 0; c < N; ++c) {
                // Step 1
                int evenpix = img_labels_row[c];

                // Step 2
                int Gp;
                if (evenpix)
                    img_labels_row[c] = Gp = -(rN + c);
                else
                    continue;

                // Step 3
                int stripestart = c;
                while (++c < N) {
                    int evenpix = img_labels_row[c];

                    if (evenpix)
                        img_labels_row[c] = Gp;
                    else
                        break;
                }
                int stripestop = c;

                if (r == 0)
                    continue;

                // Stripe union
                int lastroot = INT_MIN;
                for (int i = stripestart; i < stripestop; ++i) {
                    int linepix = img_labels_row[i];
                    if (!linepix)
                        continue;

                    int runstart = std::max(0, i - 1);
                    do
                        i++;
                    while (i < N && img_labels_row[i]);
                    int runstop = std::min(N - 1, i);

                    for (int j = runstart; j <= runstop; ++j) {
                        int curpix = img_labels_row_prev[j];
                        if (!curpix)
                            continue;

                        int newroot = FindRoot(reinterpret_cast<int*>(img_labels_.data), curpix);
                        if (newroot > lastroot) {
                            lastroot = newroot;
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), Gp, lastroot);
                        }
                        else if (newroot < lastroot) {
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), newroot, lastroot);
                        }

                        do
                            ++j;
                        while (j <= runstop && img_labels_row_prev[j]);
                    }
                }
            }
        }
    }